

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncRegister.cpp
# Opt level: O2

void __thiscall
SyncRegister::SyncRegister
          (SyncRegister *this,BoxArray *fine_boxes,DistributionMapping *dmap,IntVect *ref_ratio)

{
  BoxArray *this_00;
  FabSet *this_01;
  Orientation f;
  long lVar1;
  bool bVar2;
  BoxArray loBA;
  BndryBATransformer hitrans;
  BndryBATransformer lotrans;
  BoxArray hiBA;
  
  amrex::BndryRegister::BndryRegister(&this->super_BndryRegister);
  (this->super_BndryRegister)._vptr_BndryRegister = (_func_int **)&PTR__SyncRegister_006d8ef8;
  lVar1 = 0x970;
  do {
    amrex::FabSet::FabSet((FabSet *)((long)(this->super_BndryRegister).bndry + lVar1 + -8));
    lVar1 = lVar1 + 0x180;
  } while (lVar1 != 0x1270);
  (this->ratio).vect[2] = ref_ratio->vect[2];
  *(undefined8 *)(this->ratio).vect = *(undefined8 *)ref_ratio->vect;
  this_00 = &(this->super_BndryRegister).grids;
  amrex::BoxArray::operator=(this_00,fine_boxes);
  amrex::BoxArray::coarsen(this_00,&this->ratio);
  this_01 = (FabSet *)&this->field_0x970;
  lVar1 = 3;
  f.val = 0;
  while( true ) {
    bVar2 = lVar1 == 0;
    lVar1 = lVar1 + -1;
    if (bVar2) break;
    amrex::BATransformer::BATransformer(&lotrans,f,(IndexType)0x7,0,1,0);
    amrex::BATransformer::BATransformer(&hitrans,(Orientation)(f.val + 3),(IndexType)0x7,0,1,0);
    amrex::BoxArray::BoxArray(&loBA,this_00,&lotrans);
    amrex::BoxArray::BoxArray(&hiBA,this_00,&hitrans);
    amrex::FabSet::define
              ((FabSet *)
               &this_01[-7].m_mf.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&loBA,dmap,1);
    amrex::FabSet::define(this_01,&loBA,dmap,1);
    amrex::FabSet::define
              ((FabSet *)
               &this_01[-4].m_mf.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&hiBA,dmap,1);
    amrex::FabSet::define(this_01 + 3,&hiBA,dmap,1);
    amrex::BoxArray::~BoxArray(&hiBA);
    amrex::BoxArray::~BoxArray(&loBA);
    f.val = f.val + 1;
    this_01 = this_01 + 1;
  }
  return;
}

Assistant:

SyncRegister::SyncRegister (const BoxArray& fine_boxes,
                            const DistributionMapping& dmap,
                            const IntVect&  ref_ratio)
    : ratio(ref_ratio)
{
    BL_ASSERT(grids.size() == 0);
    BL_ASSERT(fine_boxes.isDisjoint());

    grids = fine_boxes;
    grids.coarsen(ratio);

    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
    {
        Orientation loface(dir, Orientation::low);
        Orientation hiface(dir, Orientation::high);

        BndryBATransformer lotrans(loface, IndexType::TheNodeType(), 0, 1, 0);
        BndryBATransformer hitrans(hiface, IndexType::TheNodeType(), 0, 1, 0);

        BoxArray loBA(grids, lotrans);
        BoxArray hiBA(grids, hitrans);

        bndry[loface].define(loBA,dmap,1);
        bndry_mask[loface].define(loBA,dmap,1);
        bndry[hiface].define(hiBA,dmap,1);
        bndry_mask[hiface].define(hiBA,dmap,1);
    }
}